

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O3

void ConstructionHeuristics::assignGivenDay(Solution *solution,uint dayIndex,string *skillId)

{
  pointer pvVar1;
  Turn *this;
  size_t __n;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar5;
  string *psVar6;
  Scenario *this_00;
  WeekData *this_01;
  ShiftType *this_02;
  string *shift;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar7;
  _Rb_tree_node_base *p_Var8;
  ulong uVar9;
  pointer ppTVar10;
  uint local_3c;
  pointer local_38;
  
  uVar2 = (ulong)dayIndex;
  pvVar5 = Solution::getTurns(solution);
  pvVar1 = (pvVar5->
           super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)(pvVar5->
                 super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (uVar9 < uVar2 || uVar9 - uVar2 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  ppTVar10 = pvVar1[uVar2].super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_38 = *(pointer *)
              ((long)&pvVar1[uVar2].super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                      super__Vector_impl_data + 8);
  if (ppTVar10 != local_38) {
    do {
      this = *ppTVar10;
      if (skillId->_M_string_length == 0) {
LAB_00118fb6:
        this_00 = Scenario::getInstance();
        this_01 = Scenario::getWeekData(this_00);
        psVar6 = Turn::getSkill_abi_cxx11_(this);
        this_02 = Turn::getShiftType(this);
        shift = ShiftType::getId_abi_cxx11_(this_02);
        local_3c = dayIndex;
        iVar4 = WeekData::getMinimumCoverageRequirement(this_01,psVar6,shift,(int *)&local_3c);
        if (iVar4 != 0) {
          pmVar7 = Solution::getNurses_abi_cxx11_(solution);
          for (p_Var8 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var8 != &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            bVar3 = Solution::assignNurseToTurn(solution,*(NurseSolution **)(p_Var8 + 2),this);
            if (bVar3) {
              if (iVar4 < 2) break;
              iVar4 = iVar4 + -1;
            }
          }
        }
      }
      else {
        psVar6 = Turn::getSkill_abi_cxx11_(this);
        __n = psVar6->_M_string_length;
        if ((__n == skillId->_M_string_length) &&
           ((__n == 0 ||
            (iVar4 = bcmp((psVar6->_M_dataplus)._M_p,(skillId->_M_dataplus)._M_p,__n), iVar4 == 0)))
           ) goto LAB_00118fb6;
      }
      ppTVar10 = ppTVar10 + 1;
    } while (ppTVar10 != local_38);
  }
  return;
}

Assistant:

void ConstructionHeuristics::assignGivenDay(Solution *solution, unsigned int dayIndex, const string &skillId) {
    int minimum;
    for (Turn *turn : solution->getTurns().at(dayIndex)) {
        if (!skillId.empty() && turn->getSkill() != skillId)
            continue;

        minimum = Scenario::getInstance()->getWeekData().getMinimumCoverageRequirement(turn->getSkill(),
                                                                                       turn->getShiftType()->getId(),
                                                                                       dayIndex);
        if (minimum == 0)
            continue;

        for (auto const &it : solution->getNurses())
            if (solution->assignNurseToTurn(it.second, turn))
                if (--minimum <= 0)
                    break;
    }
}